

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_NoBasicConstraintsCertSign_Test::TestBody
          (X509Test_NoBasicConstraintsCertSign_Test *this)

{
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  pointer leaf_00;
  X509 *pXVar4;
  char *in_R9;
  function<void_(x509_store_ctx_st_*)> *this_00;
  string local_2b0;
  AssertHelper local_290;
  Message local_288;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_248;
  Message local_240;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_200;
  Message local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__3;
  Message local_1d0;
  function<void_(x509_store_ctx_st_*)> local_1c8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_1a8;
  allocator<x509_st_*> local_181;
  pointer local_180;
  iterator local_178;
  size_type local_170;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_168;
  allocator<x509_st_*> local_149;
  pointer local_148;
  iterator local_140;
  size_type local_138;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_130;
  int local_118 [2];
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  string local_78;
  AssertHelper local_58;
  Message local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  UniquePtr<X509> leaf;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_20;
  UniquePtr<X509> intermediate;
  UniquePtr<X509> root;
  X509Test_NoBasicConstraintsCertSign_Test *this_local;
  
  CertFromPEM((anon_unknown_dwarf_52317d *)&intermediate,
              "\n-----BEGIN CERTIFICATE-----\nMIICTTCCAbagAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwKzEXMBUGA1UE\nChMOQm9yaW5nU1NMIFRlc3QxEDAOBgNVBAMTB1Jvb3QgQ0EwHhcNMTUwMTAxMDAw\nMDAwWhcNMjUwMTAxMDAwMDAwWjArMRcwFQYDVQQKEw5Cb3JpbmdTU0wgVGVzdDEQ\nMA4GA1UEAxMHUm9vdCBDQTCBnzANBgkqhkiG9w0BAQEFAAOBjQAwgYkCgYEA6Q5/\nEQzmWuaGg3D2UQcuAngR9bIkkjjuJmICx5TxPqF3asCP1SJotl3iTNrghRE1wpJy\nSY2BtIiXa7f8skRb2U0GcPkMxo/ps9+jaoRsQ1m+nbLQdpvD1/qZWcO45fNTA71J\n1rPMokP+rcILuQG4VimUAySnDSghKamulFtK+Z8CAwEAAaN6MHgwDgYDVR0PAQH/\nBAQDAgIEMB0GA1UdJQQWMBQGCCsGAQUFBwMBBggrBgEFBQcDAjAPBgNVHRMBAf8E\nBTADAQH/MBkGA1UdDgQSBBBAN9cB+0AvuBx+VAQnjFkBMBsGA1UdIwQUMBKAEEA3\n1wH7QC+4HH5UBCeMWQEwDQYJKoZIhvcNAQELBQADgYEAc4N6hTE62/3gwg+kyc2f\nc/Jj1mHrOt+0NRaBnmvbmNpsEjHS96Ef4Wt/ZlPXPkkv1C1VosJnOIMF3Q522wRH\nbqaxARldS12VAa3gcWisDWD+SqSyDxjyojz0XDiJkTrFuCTCUiZO+1GLB7SO10Ms\nd5YVX0c90VMnUhF/dlrqS9U=\n-----END CERTIFICATE-----\n"
             );
  CertFromPEM((anon_unknown_dwarf_52317d *)&local_20,
              "\n-----BEGIN CERTIFICATE-----\nMIIBqjCCAROgAwIBAgIBAjANBgkqhkiG9w0BAQsFADArMRcwFQYDVQQKEw5Cb3Jp\nbmdTU0wgVGVzdDEQMA4GA1UEAxMHUm9vdCBDQTAgFw0wMDAxMDEwMDAwMDBaGA8y\nMDk5MDEwMTAwMDAwMFowHzEdMBsGA1UEAxMUTm8gQmFzaWMgQ29uc3RyYWludHMw\nWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAASEFMblfxIEDO8My7wHtHWTuDzNyID1\nOsPkMGkn32O/pSyXxXuAqDeFoMVffUMTyfm8JcYugSEbrv2qEXXM4bZRoy8wLTAO\nBgNVHQ8BAf8EBAMCAgQwGwYDVR0jBBQwEoAQQDfXAftAL7gcflQEJ4xZATANBgkq\nhkiG9w0BAQsFAAOBgQC1Lh6hIAm3K5kRh5iIydU0YAEm7eV6ZSskERDUq3DLJyl9\nZUZCHUzvb464dkwZjeNzaUVS1pdElJslwX3DtGgeJLJGCnk8zUjBjaNrrDm0kzPW\nxKt/6oif1ci/KCKqKNXJAIFbc4e+IiBpenwpxHk3If4NM+Ek0nKoO8Uj0NkgTQ==\n-----END CERTIFICATE-----\n"
             );
  CertFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar_.message_,
              "\n-----BEGIN CERTIFICATE-----\nMIIBUDCB96ADAgECAgEDMAoGCCqGSM49BAMCMB8xHTAbBgNVBAMTFE5vIEJhc2lj\nIENvbnN0cmFpbnRzMCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAx\nMS8wLQYDVQQDEyZMZWFmIGZyb20gQ0Egd2l0aCBubyBCYXNpYyBDb25zdHJhaW50\nczBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABEsYPMwzdJKjB+2gpC90ib2ilHoB\nw/arQ6ikUX0CNUDDaKaOu/jF39ogzVlg4lDFrjCKShSfCCcrwgONv70IZGijEDAO\nMAwGA1UdEwEB/wQCMAAwCgYIKoZIzj0EAwIDSAAwRQIgbV7R99yM+okXSIs6Fp3o\neCOXiDL60IBxaTOcLS44ywcCIQDbn87Gj5cFgHBYAkzdHqDsyGXkxQTHDq9jmX24\nDjy3Zw==\n-----END CERTIFICATE-----\n"
             );
  testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_48,&intermediate,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_48,(AssertionResult *)0x8b3006,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xb73,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(&local_50);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_90,&local_20,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_90,(AssertionResult *)0x890406,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xb74,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_98);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_d0,(AssertionResult *)0x890444,
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xb75,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_118[1] = 0x18;
        leaf_00 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        local_148 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&intermediate);
        local_140 = &local_148;
        local_138 = 1;
        std::allocator<x509_st_*>::allocator(&local_149);
        __l_00._M_len = local_138;
        __l_00._M_array = local_140;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_130,__l_00,&local_149);
        local_180 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_20);
        local_178 = &local_180;
        local_170 = 1;
        std::allocator<x509_st_*>::allocator(&local_181);
        __l._M_len = local_170;
        __l._M_array = local_178;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_168,__l,&local_181);
        local_1a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_1a8);
        this_00 = &local_1c8;
        std::function<void_(x509_store_ctx_st_*)>::function(this_00,(nullptr_t)0x0);
        local_118[0] = Verify(leaf_00,&local_130,&local_168,&local_1a8,0,this_00);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_110,"24",
                   "Verify(leaf.get(), {root.get()}, {intermediate.get()}, {}, 0)",local_118 + 1,
                   local_118);
        std::function<void_(x509_store_ctx_st_*)>::~function(&local_1c8);
        std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_1a8);
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_168);
        std::allocator<x509_st_*>::~allocator(&local_181);
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_130);
        std::allocator<x509_st_*>::~allocator(&local_149);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar1) {
          testing::Message::Message(&local_1d0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb7a,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__3.message_,&local_1d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_1d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_20);
        local_1ec = X509_check_purpose(pXVar4,-1,1);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_1e8,&local_1ec,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
        if (!bVar1) {
          testing::Message::Message(&local_1f8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_1e8,
                     (AssertionResult *)"X509_check_purpose(intermediate.get(), -1, 1)","false",
                     "true",(char *)this_00);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb7f,pcVar3);
          testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_1f8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
        pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_20);
        local_234 = X509_check_purpose(pXVar4,7,1);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_230,&local_234,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
        if (!bVar1) {
          testing::Message::Message(&local_240);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_230,
                     (AssertionResult *)"X509_check_purpose(intermediate.get(), 7, 1)","false",
                     "true",(char *)this_00);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_248,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb81,pcVar3);
          testing::internal::AssertHelper::operator=(&local_248,&local_240);
          testing::internal::AssertHelper::~AssertHelper(&local_248);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_240);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
        pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_20);
        iVar2 = X509_check_purpose(pXVar4,2,1);
        local_279 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_278,&local_279,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
        if (!bVar1) {
          testing::Message::Message(&local_288);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_2b0,(internal *)local_278,
                     (AssertionResult *)"X509_check_purpose(intermediate.get(), 2, 1)","true",
                     "false",(char *)this_00);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb83,pcVar3);
          testing::internal::AssertHelper::operator=(&local_290,&local_288);
          testing::internal::AssertHelper::~AssertHelper(&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          testing::Message::~Message(&local_288);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&intermediate);
  return;
}

Assistant:

TEST(X509Test, NoBasicConstraintsCertSign) {
  bssl::UniquePtr<X509> root(CertFromPEM(kSANTypesRoot));
  bssl::UniquePtr<X509> intermediate(
      CertFromPEM(kNoBasicConstraintsCertSignIntermediate));
  bssl::UniquePtr<X509> leaf(CertFromPEM(kNoBasicConstraintsCertSignLeaf));

  ASSERT_TRUE(root);
  ASSERT_TRUE(intermediate);
  ASSERT_TRUE(leaf);

  // The intermediate has keyUsage certSign, but is not marked as a CA in the
  // basicConstraints.
  EXPECT_EQ(X509_V_ERR_INVALID_CA,
            Verify(leaf.get(), {root.get()}, {intermediate.get()}, {}, 0));

  // |X509_check_purpose| with |X509_PURPOSE_ANY| and purpose -1 do not check
  // basicConstraints, but other purpose types do. (This is redundant with the
  // actual basicConstraints check, but |X509_check_purpose| is public API.)
  EXPECT_TRUE(X509_check_purpose(intermediate.get(), -1, /*ca=*/1));
  EXPECT_TRUE(
      X509_check_purpose(intermediate.get(), X509_PURPOSE_ANY, /*ca=*/1));
  EXPECT_FALSE(X509_check_purpose(intermediate.get(), X509_PURPOSE_SSL_SERVER,
                                  /*ca=*/1));
}